

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
GetSetter_Internal<false>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,Var *setterValue,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  code *pcVar1;
  DynamicObject *instance_00;
  bool bVar2;
  uint32 index;
  undefined4 *puVar3;
  ScriptContext *this_00;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_01;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_local;
  
  descriptor = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)setterValue;
  setterValue_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x5ce,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = RecyclableObject::GetScriptContext(&pDStack_20->super_RecyclableObject);
  local_50 = ScriptContext::GetPropertyName(this_00,setterValue_local._4_4_);
  this_01 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)this_01,&local_50,
                     (SimpleDictionaryPropertyDescriptor<unsigned_short> **)&propertyRecord);
  if (bVar2) {
    this_local._4_4_ =
         GetSetterFromDescriptor<false>
                   (this,(SimpleDictionaryPropertyDescriptor<unsigned_short> *)propertyRecord);
  }
  else {
    bVar2 = PropertyRecord::IsNumeric(local_50);
    instance_00 = pDStack_20;
    if (bVar2) {
      index = PropertyRecord::GetNumericValue(local_50);
      this_local._4_4_ =
           DynamicTypeHandler::GetItemSetter
                     (&this->super_DynamicTypeHandler,instance_00,index,&info_local->m_instance,
                      (ScriptContext *)descriptor);
    }
    else {
      this_local._4_4_ = None;
    }
  }
  return this_local._4_4_;
}

Assistant:

DescriptorFlags SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetSetter_Internal(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            return GetSetterFromDescriptor<allowLetConstGlobal>(descriptor);
        }

        if (propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetItemSetter(instance, propertyRecord->GetNumericValue(), setterValue, requestContext);
        }

        return None;
    }